

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t best_effort_strncat_in_locale
                  (archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  archive_string *paVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  wchar_t wVar5;
  char cVar6;
  char *p;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  mbstate_t_conflict shift_state;
  wchar_t wc;
  mbstate_t local_38;
  wchar_t local_2c;
  
  if (sc->same == L'\0') {
    paVar1 = archive_string_ensure(as,length + as->length + 1);
    wVar5 = L'\xffffffff';
    if (paVar1 != (archive_string *)0x0) {
      pcVar7 = as->s;
      pcVar3 = pcVar7 + as->length;
      cVar6 = *_p;
      wVar5 = L'\0';
      if (length != 0 && cVar6 != '\0') {
        uVar4 = ~as->length + as->buffer_length;
        pcVar7 = (char *)((long)_p + 1);
        wVar5 = L'\0';
        lVar8 = length + 3;
        do {
          if (cVar6 < '\0') {
            if ((sc->flag & L'Ā') == L'\0') {
              *pcVar3 = '?';
              pcVar3 = pcVar3 + 1;
            }
            else {
              if (uVar4 < 3) {
                as->length = (long)pcVar3 - (long)as->s;
                paVar1 = archive_string_ensure(as,as->buffer_length + lVar8);
                if (paVar1 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                pcVar3 = as->s + as->length;
                uVar4 = ~as->length + as->buffer_length;
              }
              pcVar3[0] = -0x11;
              pcVar3[1] = -0x41;
              pcVar3[2] = -0x43;
              pcVar3 = pcVar3 + 3;
              uVar4 = uVar4 - 3;
            }
            wVar5 = L'\xffffffff';
          }
          else {
            *pcVar3 = cVar6;
            pcVar3 = pcVar3 + 1;
          }
          cVar6 = *pcVar7;
          if (cVar6 == '\0') break;
          pcVar7 = pcVar7 + 1;
          bVar9 = lVar8 != 4;
          lVar8 = lVar8 + -1;
        } while (bVar9);
        pcVar7 = as->s;
      }
      as->length = (long)pcVar3 - (long)pcVar7;
      *pcVar3 = '\0';
    }
  }
  else {
    paVar1 = archive_string_append(as,(char *)_p,length);
    if (paVar1 == (archive_string *)0x0) {
LAB_0018433c:
      wVar5 = L'\xffffffff';
    }
    else {
      local_38.__count = 0;
      local_38.__value = (_union_27)0x0;
      wVar5 = L'\0';
      if (length != 0) {
        do {
          sVar2 = mbrtowc(&local_2c,(char *)_p,length,&local_38);
          if (0xfffffffffffffffd < sVar2) goto LAB_0018433c;
          if (sVar2 == 0) {
            return L'\0';
          }
          _p = (void *)((long)_p + sVar2);
          length = length - sVar2;
        } while (length != 0);
      }
    }
  }
  return wVar5;
}

Assistant:

static int
best_effort_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	size_t remaining;
	char *otp;
	const uint8_t *itp;
	size_t avail;
	int return_value = 0; /* success */

	/*
	 * If both from-locale and to-locale is the same, this makes a copy.
	 * And then this checks all copied MBS can be WCS if so returns 0.
	 */
	if (sc->same) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (invalid_mbs(_p, length, sc));
	}

	/*
	 * If a character is ASCII, this just copies it. If not, this
	 * assigns '?' charater instead but in UTF-8 locale this assigns
	 * byte sequence 0xEF 0xBD 0xBD, which are code point U+FFFD,
	 * a Replacement Character in Unicode.
	 */
	if (archive_string_ensure(as, as->length + length + 1) == NULL)
		return (-1);

	remaining = length;
	itp = (const uint8_t *)_p;
	otp = as->s + as->length;
	avail = as->buffer_length - as->length -1;
	while (*itp && remaining > 0) {
		if (*itp > 127 && (sc->flag & SCONV_TO_UTF8)) {
			if (avail < UTF8_R_CHAR_SIZE) {
				as->length = otp - as->s;
				if (NULL == archive_string_ensure(as,
				    as->buffer_length + remaining +
				    UTF8_R_CHAR_SIZE))
					return (-1);
				otp = as->s + as->length;
				avail = as->buffer_length - as->length -1;
			}
			/*
		 	 * When coping a string in UTF-8, unknown character
			 * should be U+FFFD (replacement character).
			 */
			UTF8_SET_R_CHAR(otp);
			otp += UTF8_R_CHAR_SIZE;
			avail -= UTF8_R_CHAR_SIZE;
			itp++;
			remaining--;
			return_value = -1;
		} else if (*itp > 127) {
			*otp++ = '?';
			itp++;
			remaining--;
			return_value = -1;
		} else {
			*otp++ = (char)*itp++;
			remaining--;
		}
	}
	as->length = otp - as->s;
	as->s[as->length] = '\0';
	return (return_value);
}